

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O3

Oop __thiscall Lodtalk::Behavior::superLookupSelector(Behavior *this,Oop selector)

{
  Oop OVar1;
  Behavior *pBVar2;
  
  pBVar2 = this->superclass;
  if (pBVar2 != (Behavior *)&NilObject) {
    do {
      if (pBVar2->methodDict == (MethodDictionary *)&NilObject) {
        return (Oop)(uint8_t *)&NilObject;
      }
      OVar1 = MethodDictionary::internalAtOrNil(pBVar2->methodDict,selector);
      if (OVar1.field_0 != (anon_union_8_4_0eb573b0_for_Oop_0)&NilObject) {
        return (Oop)OVar1.field_0.pointer;
      }
      pBVar2 = pBVar2->superclass;
    } while (pBVar2 != (Behavior *)&NilObject);
  }
  return (Oop)(uint8_t *)&NilObject;
}

Assistant:

Oop Behavior::superLookupSelector(Oop selector)
{
	// Find in the super class.
	if(isNil(superclass))
		return nilOop();
	return superclass->lookupSelector(selector);
}